

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktPipelineMultisampleShaderBuiltInTests.cpp
# Opt level: O1

TestStatus * __thiscall
vkt::pipeline::multisample::MSInstance<vkt::pipeline::multisample::MSInstanceSamplePosDistribution>
::verifyImageData(TestStatus *__return_storage_ptr__,
                 MSInstance<vkt::pipeline::multisample::MSInstanceSamplePosDistribution> *this,
                 VkImageCreateInfo *imageMSInfo,VkImageCreateInfo *imageRSInfo,
                 vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                 *dataPerSample,ConstPixelBufferAccess *dataRS)

{
  float *pfVar1;
  bool bVar2;
  undefined8 uVar3;
  bool bVar4;
  byte bVar5;
  int i;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  uint uVar10;
  int iVar11;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *pvVar12;
  uint uVar13;
  ulong uVar14;
  VkImageCreateInfo *pVVar15;
  uint y;
  long lVar16;
  bool bVar17;
  bool bVar18;
  float fVar19;
  float fVar20;
  Vector<float,_2> res;
  Vec2 distanceFromCenter_1;
  Vec2 distanceFromCenter;
  Vec2 averageSamplePos;
  undefined1 local_f8 [36];
  uint local_d4;
  int local_d0;
  uint local_cc;
  TestStatus *local_c8;
  float local_bc;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b8;
  ulong local_b0;
  string *local_a8;
  float local_a0 [4];
  VkImageCreateInfo *local_90;
  undefined1 local_88 [24];
  undefined1 local_70 [24];
  string *local_58;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> *local_50;
  float local_44;
  long local_40;
  float local_38 [2];
  
  local_b0 = (ulong)imageMSInfo->samples;
  local_44 = (float)local_b0;
  fVar19 = 1.0 / (local_44 * 12.0);
  local_c8 = __return_storage_ptr__;
  local_90 = imageMSInfo;
  local_50 = dataPerSample;
  if (fVar19 < 0.0) {
    fVar19 = sqrtf(fVar19);
  }
  else {
    fVar19 = SQRT(fVar19);
  }
  bVar18 = (imageRSInfo->extent).depth != 0;
  local_a0[3] = fVar19 + fVar19;
  if (bVar18) {
    local_a8 = (string *)&local_c8->m_description;
    local_b8 = &(local_c8->m_description).field_2;
    uVar10 = 0;
    do {
      local_d4 = CONCAT31(local_d4._1_3_,bVar18);
      bVar18 = (imageRSInfo->extent).height != 0;
      if (bVar18) {
        uVar13 = 0;
        do {
          if ((imageRSInfo->extent).width != 0) {
            y = 0;
            do {
              iVar11 = (int)dataRS;
              tcu::ConstPixelBufferAccess::getPixelInt
                        ((ConstPixelBufferAccess *)local_f8,iVar11,y,uVar13);
              if ((float)local_f8._8_4_ != 0.0) {
                local_f8._0_8_ = (long)local_f8 + 0x10;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)local_f8,"gl_SamplePosition is not within interval [0,1]","");
                local_c8->m_code = QP_TEST_RESULT_FAIL;
                (local_c8->m_description)._M_dataplus._M_p = (pointer)local_b8;
                std::__cxx11::string::_M_construct<char*>
                          (local_a8,local_f8._0_8_,
                           (undefined1 *)(CONCAT44(local_f8._12_4_,local_f8._8_4_) + local_f8._0_8_)
                          );
LAB_004ee2c8:
                if (local_f8._0_8_ != (long)local_f8 + 0x10) {
                  operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
                }
                if (!bVar18) goto LAB_004ee2e9;
                if ((local_d4 & 1) != 0) {
                  return local_c8;
                }
                goto LAB_004ee306;
              }
              if (3 < (uint)local_b0) {
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)local_f8,iVar11,y,uVar13);
                local_bc = (float)(local_f8._0_8_ & 0xffffffff) / 255.0;
                tcu::ConstPixelBufferAccess::getPixelInt
                          ((ConstPixelBufferAccess *)local_88,iVar11,y,uVar13);
                local_70._4_4_ = (float)((ulong)local_88._0_8_ >> 0x20) / 255.0;
                local_70._0_4_ = local_bc;
                local_a0[0] = 0.5;
                local_a0[1] = 0.5;
                local_f8._0_4_ = R;
                local_f8._4_4_ = SNORM_INT8;
                lVar6 = 0;
                do {
                  *(float *)(local_f8 + lVar6 * 4) =
                       *(float *)(local_70 + lVar6 * 4) - local_a0[lVar6];
                  lVar6 = lVar6 + 1;
                } while (lVar6 == 1);
                local_88._0_4_ = R;
                local_88._4_4_ = SNORM_INT8;
                lVar6 = 0;
                do {
                  fVar19 = *(float *)(local_f8 + lVar6 * 4);
                  fVar20 = -fVar19;
                  if (-fVar19 <= fVar19) {
                    fVar20 = fVar19;
                  }
                  *(float *)(local_88 + lVar6 * 4) = fVar20;
                  lVar6 = lVar6 + 1;
                } while (lVar6 == 1);
                if ((local_a0[3] < (float)local_88._0_4_) || (local_a0[3] < (float)local_88._4_4_))
                {
                  local_f8._0_8_ = (long)local_f8 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_f8,
                             "Sample positions are not uniformly distributed within the pixel","");
                  local_c8->m_code = QP_TEST_RESULT_FAIL;
                  (local_c8->m_description)._M_dataplus._M_p = (pointer)local_b8;
                  std::__cxx11::string::_M_construct<char*>
                            (local_a8,local_f8._0_8_,
                             (undefined1 *)
                             (CONCAT44(local_f8._12_4_,local_f8._8_4_) + local_f8._0_8_));
                  goto LAB_004ee2c8;
                }
              }
              y = y + 1;
            } while (y < (imageRSInfo->extent).width);
          }
          uVar13 = uVar13 + 1;
          bVar18 = uVar13 < (imageRSInfo->extent).height;
        } while (bVar18);
      }
LAB_004ee2e9:
      uVar10 = uVar10 + 1;
      bVar18 = uVar10 < (imageRSInfo->extent).depth;
    } while (bVar18);
  }
LAB_004ee306:
  if ((local_90->extent).depth != 0) {
    bVar18 = local_b0 != 0;
    local_58 = (string *)&local_c8->m_description;
    local_70._16_8_ = &(local_c8->m_description).field_2;
    local_40 = local_b0 * 0x28;
    local_d4 = 0;
    pvVar12 = local_50;
    uVar14 = local_b0;
    pVVar15 = local_90;
    do {
      if ((pVVar15->extent).height != 0) {
        local_cc = 0;
        do {
          if ((pVVar15->extent).width != 0) {
            uVar10 = 0;
            do {
              std::vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>::vector
                        ((vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *)
                         local_88,uVar14,(allocator_type *)local_f8);
              local_d0 = 0x14;
              local_a8 = (string *)CONCAT44(local_a8._4_4_,uVar10);
              bVar5 = bVar18;
              if (uVar14 != 0) {
                lVar16 = 4;
                uVar14 = 1;
                lVar6 = 0;
                local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                            *)CONCAT71(local_b8._1_7_,bVar18);
                uVar13 = local_cc;
                do {
                  iVar11 = (int)lVar6;
                  tcu::ConstPixelBufferAccess::getPixelInt
                            ((ConstPixelBufferAccess *)local_f8,
                             (int)(pvVar12->
                                  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                  )._M_impl.super__Vector_impl_data._M_start + iVar11,uVar10,uVar13)
                  ;
                  local_bc = (float)local_f8._8_4_;
                  if ((float)local_f8._8_4_ == 0.0) {
                    tcu::ConstPixelBufferAccess::getPixelInt
                              ((ConstPixelBufferAccess *)local_f8,
                               (int)(pvVar12->
                                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                    )._M_impl.super__Vector_impl_data._M_start + iVar11,uVar10,
                               uVar13);
                    uVar3 = local_f8._0_8_;
                    tcu::ConstPixelBufferAccess::getPixelInt
                              ((ConstPixelBufferAccess *)local_70,
                               (int)(pvVar12->
                                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                                    )._M_impl.super__Vector_impl_data._M_start + iVar11,uVar10,
                               local_cc);
                    *(float *)((local_88._0_8_ - 4) + lVar16) = (float)(uVar3 & 0xffffffff) / 255.0;
                    *(float *)(local_88._0_8_ + lVar16) =
                         (float)((ulong)local_70._0_8_ >> 0x20) / 255.0;
                    pvVar12 = local_50;
                    uVar13 = local_cc;
                    uVar10 = (uint)local_a8;
                  }
                  else {
                    local_f8._0_8_ = (long)local_f8 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_f8,"gl_SamplePosition is not within interval [0,1]",
                               "");
                    local_c8->m_code = QP_TEST_RESULT_FAIL;
                    (local_c8->m_description)._M_dataplus._M_p = (pointer)local_70._16_8_;
                    std::__cxx11::string::_M_construct<char*>
                              (local_58,local_f8._0_8_,
                               (undefined1 *)
                               (CONCAT44(local_f8._12_4_,local_f8._8_4_) + local_f8._0_8_));
                    if (local_f8._0_8_ != (long)local_f8 + 0x10) {
                      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
                    }
                  }
                  if (local_bc != 0.0) {
                    local_d0 = 1;
                    break;
                  }
                  local_b8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                              *)CONCAT71(local_b8._1_7_,uVar14 < local_b0);
                  lVar6 = lVar6 + 0x28;
                  lVar16 = lVar16 + 8;
                  uVar14 = uVar14 + 1;
                } while (local_40 != lVar6);
                uVar14 = local_b0;
                pVVar15 = local_90;
                bVar5 = (byte)local_b8;
              }
              if ((bVar5 & 1) == 0) {
                uVar9 = 1;
                uVar7 = 0;
                do {
                  if (uVar7 == uVar14) {
                    iVar11 = 0x17;
                    break;
                  }
                  bVar17 = uVar7 + 1 < uVar14;
                  if (bVar17) {
                    fVar19 = *(float *)(local_88._0_8_ + uVar7 * 8);
                    uVar8 = uVar9;
                    do {
                      pfVar1 = (float *)(local_88._0_8_ + uVar8 * 8);
                      if ((fVar19 == *pfVar1) && (!NAN(fVar19) && !NAN(*pfVar1))) {
                        bVar4 = false;
                        do {
                          bVar2 = bVar4;
                          if (bVar2) goto LAB_004ee5c0;
                          fVar20 = *(float *)(local_88._0_8_ + 4 + uVar7 * 8);
                          pfVar1 = (float *)(local_88._0_8_ + 4 + uVar8 * 8);
                        } while ((fVar20 == *pfVar1) &&
                                (bVar4 = true, !NAN(fVar20) && !NAN(*pfVar1)));
                        if (bVar2) {
LAB_004ee5c0:
                          local_f8._0_8_ = (long)local_f8 + 0x10;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)local_f8,"Two samples have the same position","");
                          local_c8->m_code = QP_TEST_RESULT_FAIL;
                          (local_c8->m_description)._M_dataplus._M_p = (pointer)local_70._16_8_;
                          std::__cxx11::string::_M_construct<char*>
                                    (local_58,local_f8._0_8_,
                                     (undefined1 *)
                                     (CONCAT44(local_f8._12_4_,local_f8._8_4_) + local_f8._0_8_));
                          if (local_f8._0_8_ != (long)local_f8 + 0x10) {
                            operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
                          }
                          iVar11 = 1;
                          goto LAB_004ee634;
                        }
                      }
                      uVar8 = uVar8 + 1;
                      bVar17 = uVar8 < uVar14;
                    } while ((uint)uVar14 != (uint)uVar8);
                  }
                  iVar11 = 0x1a;
LAB_004ee634:
                  uVar9 = (ulong)((int)uVar9 + 1);
                  pvVar12 = local_50;
                  uVar7 = uVar7 + 1;
                  uVar10 = (uint)local_a8;
                } while (!bVar17);
                bVar17 = iVar11 == 0x17;
                if (bVar17) {
                  iVar11 = 0;
                }
                local_d0 = iVar11;
                if (bVar17 && 3 < (uint)uVar14) {
                  fVar19 = 0.0;
                  uVar7 = 0;
                  fVar20 = 0.0;
                  do {
                    fVar19 = fVar19 + *(float *)(local_88._0_8_ + uVar7 * 8);
                    fVar20 = fVar20 + *(float *)(local_88._0_8_ + 4 + uVar7 * 8);
                    uVar7 = uVar7 + 1;
                  } while (uVar14 != uVar7);
                  local_70._4_4_ = fVar20 / local_44;
                  local_70._0_4_ = fVar19 / local_44;
                  local_38[0] = 0.5;
                  local_38[1] = 0.5;
                  local_f8._0_4_ = R;
                  local_f8._4_4_ = SNORM_INT8;
                  lVar6 = 0;
                  do {
                    *(float *)(local_f8 + lVar6 * 4) =
                         *(float *)(local_70 + lVar6 * 4) - local_38[lVar6];
                    lVar6 = lVar6 + 1;
                  } while (lVar6 == 1);
                  local_a0[0] = 0.0;
                  local_a0[1] = 0.0;
                  lVar6 = 0;
                  do {
                    fVar19 = *(float *)(local_f8 + lVar6 * 4);
                    fVar20 = -fVar19;
                    if (-fVar19 <= fVar19) {
                      fVar20 = fVar19;
                    }
                    local_a0[lVar6] = fVar20;
                    lVar6 = lVar6 + 1;
                  } while (lVar6 == 1);
                  if ((local_a0[3] < local_a0[0]) || (local_a0[3] < local_a0[1])) {
                    local_f8._0_8_ = (long)local_f8 + 0x10;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)local_f8,
                               "Sample positions are not uniformly distributed within the pixel","")
                    ;
                    local_c8->m_code = QP_TEST_RESULT_FAIL;
                    (local_c8->m_description)._M_dataplus._M_p = (pointer)local_70._16_8_;
                    std::__cxx11::string::_M_construct<char*>
                              (local_58,local_f8._0_8_,
                               (undefined1 *)
                               (CONCAT44(local_f8._12_4_,local_f8._8_4_) + local_f8._0_8_));
                    if (local_f8._0_8_ != (long)local_f8 + 0x10) {
                      operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
                    }
                    local_d0 = 1;
                  }
                  else {
                    local_d0 = 0;
                  }
                }
              }
              if ((TextureFormat)local_88._0_8_ != (TextureFormat)0x0) {
                operator_delete((void *)local_88._0_8_,local_88._16_8_ - local_88._0_8_);
              }
              iVar11 = local_d0;
              if (local_d0 != 0) goto LAB_004ee80a;
              uVar10 = uVar10 + 1;
            } while (uVar10 < (pVVar15->extent).width);
          }
          iVar11 = 0x11;
LAB_004ee80a:
          if (iVar11 != 0x11) goto LAB_004ee828;
          local_cc = local_cc + 1;
        } while (local_cc < (pVVar15->extent).height);
      }
      iVar11 = 0xe;
LAB_004ee828:
      if (iVar11 != 0xe) goto LAB_004ee846;
      local_d4 = local_d4 + 1;
    } while (local_d4 < (pVVar15->extent).depth);
    iVar11 = 0xb;
LAB_004ee846:
    if (iVar11 != 0xb) {
      return local_c8;
    }
  }
  local_f8._0_8_ = (long)local_f8 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_f8,"Passed","");
  local_c8->m_code = QP_TEST_RESULT_PASS;
  (local_c8->m_description)._M_dataplus._M_p = (pointer)&(local_c8->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8->m_description,local_f8._0_8_,
             (undefined1 *)(CONCAT44(local_f8._12_4_,local_f8._8_4_) + local_f8._0_8_));
  if (local_f8._0_8_ != (long)local_f8 + 0x10) {
    operator_delete((void *)local_f8._0_8_,local_f8._16_8_ + 1);
  }
  return local_c8;
}

Assistant:

tcu::TestStatus MSInstance<MSInstanceSamplePosDistribution>::verifyImageData	(const vk::VkImageCreateInfo&						imageMSInfo,
																						 const vk::VkImageCreateInfo&						imageRSInfo,
																						 const std::vector<tcu::ConstPixelBufferAccess>&	dataPerSample,
																						 const tcu::ConstPixelBufferAccess&					dataRS) const
{
	const deUint32 numSamples = static_cast<deUint32>(imageMSInfo.samples);

	// approximate Bates distribution as normal
	const float variance = (1.0f / (12.0f * (float)numSamples));
	const float standardDeviation = deFloatSqrt(variance);

	// 95% of means of sample positions are within 2 standard deviations if
	// they were randomly assigned. Sample patterns are expected to be more
	// uniform than a random pattern.
	const float distanceThreshold = 2.0f * standardDeviation;

	for (deUint32 z = 0u; z < imageRSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageRSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageRSInfo.extent.width;  ++x)
	{
		const deUint32 errorComponent = dataRS.getPixelUint(x, y, z).z();

		if (errorComponent > 0)
			return tcu::TestStatus::fail("gl_SamplePosition is not within interval [0,1]");

		if (numSamples >= VK_SAMPLE_COUNT_4_BIT)
		{
			const tcu::Vec2 averageSamplePos	= tcu::Vec2((float)dataRS.getPixelUint(x, y, z).x() / 255.0f, (float)dataRS.getPixelUint(x, y, z).y() / 255.0f);
			const tcu::Vec2	distanceFromCenter	= tcu::abs(averageSamplePos - tcu::Vec2(0.5f, 0.5f));

			if (distanceFromCenter.x() > distanceThreshold || distanceFromCenter.y() > distanceThreshold)
				return tcu::TestStatus::fail("Sample positions are not uniformly distributed within the pixel");
		}
	}

	for (deUint32 z = 0u; z < imageMSInfo.extent.depth;  ++z)
	for (deUint32 y = 0u; y < imageMSInfo.extent.height; ++y)
	for (deUint32 x = 0u; x < imageMSInfo.extent.width;  ++x)
	{
		std::vector<tcu::Vec2> samplePositions(numSamples);

		for (deUint32 sampleNdx = 0u; sampleNdx < numSamples; ++sampleNdx)
		{
			const deUint32 errorComponent = dataPerSample[sampleNdx].getPixelUint(x, y, z).z();

			if (errorComponent > 0)
				return tcu::TestStatus::fail("gl_SamplePosition is not within interval [0,1]");

			samplePositions[sampleNdx] = tcu::Vec2( (float)dataPerSample[sampleNdx].getPixelUint(x, y, z).x() / 255.0f,
													(float)dataPerSample[sampleNdx].getPixelUint(x, y, z).y() / 255.0f);
		}

		for (deUint32 sampleNdxA = 0u;				sampleNdxA < numSamples; ++sampleNdxA)
		for (deUint32 sampleNdxB = sampleNdxA + 1u; sampleNdxB < numSamples; ++sampleNdxB)
		{
			if (samplePositions[sampleNdxA] == samplePositions[sampleNdxB])
				return tcu::TestStatus::fail("Two samples have the same position");
		}

		if (numSamples >= VK_SAMPLE_COUNT_4_BIT)
		{
			tcu::Vec2 averageSamplePos(0.0f, 0.0f);

			for (deUint32 sampleNdx = 0u; sampleNdx < numSamples; ++sampleNdx)
			{
				averageSamplePos.x() += samplePositions[sampleNdx].x();
				averageSamplePos.y() += samplePositions[sampleNdx].y();
			}

			averageSamplePos.x() /= (float)numSamples;
			averageSamplePos.y() /= (float)numSamples;

			const tcu::Vec2	distanceFromCenter = tcu::abs(averageSamplePos - tcu::Vec2(0.5f, 0.5f));

			if (distanceFromCenter.x() > distanceThreshold || distanceFromCenter.y() > distanceThreshold)
				return tcu::TestStatus::fail("Sample positions are not uniformly distributed within the pixel");
		}
	}

	return tcu::TestStatus::pass("Passed");
}